

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitFieldDeclaration(SyntaxDumper *this,FieldDeclarationSyntax *node)

{
  SyntaxToken local_a8;
  SyntaxToken local_60;
  DeclaratorListSyntax *local_28;
  DeclaratorListSyntax *iter_1;
  SpecifierListSyntax *iter;
  FieldDeclarationSyntax *node_local;
  SyntaxDumper *this_local;
  
  iter = (SpecifierListSyntax *)node;
  node_local = (FieldDeclarationSyntax *)this;
  traverseDeclaration(this,(DeclarationSyntax *)node);
  for (iter_1 = (DeclaratorListSyntax *)
                FieldDeclarationSyntax::specifiers((FieldDeclarationSyntax *)iter);
      iter_1 != (DeclaratorListSyntax *)0x0;
      iter_1 = (iter_1->
               super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
               ).
               super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(iter_1->
                    super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                    ).
                    super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                    .value);
  }
  for (local_28 = FieldDeclarationSyntax::declarators((FieldDeclarationSyntax *)iter);
      local_28 != (DeclaratorListSyntax *)0x0;
      local_28 = (local_28->
                 super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 ).
                 super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                 .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(local_28->
                    super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                    ).
                    super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                    .value);
    SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>::delimiterToken(&local_60,local_28);
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_60,iter);
    SyntaxToken::~SyntaxToken(&local_60);
  }
  FieldDeclarationSyntax::semicolonToken(&local_a8,(FieldDeclarationSyntax *)iter);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_a8,iter);
  SyntaxToken::~SyntaxToken(&local_a8);
  return Skip;
}

Assistant:

virtual Action visitFieldDeclaration(const FieldDeclarationSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        for (auto iter = node->declarators(); iter; iter = iter->next) {
            nonterminal(iter->value);
            terminal(iter->delimiterToken(), node);
        }
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }